

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O0

int tnt_reply_len(char *buf,size_t size,size_t *len)

{
  uint64_t uVar1;
  size_t length;
  char *p;
  size_t *len_local;
  size_t size_local;
  char *buf_local;
  
  if (size < 5) {
    *len = 5 - size;
    buf_local._0_4_ = 1;
  }
  else {
    buf_local._7_1_ = *buf;
    if (mp_type_hint[buf_local._7_1_] == MP_UINT) {
      length = (size_t)buf;
      p = (char *)len;
      len_local = (size_t *)size;
      size_local = (size_t)buf;
      uVar1 = mp_decode_uint((char **)&length);
      if (len_local < (size_t *)(uVar1 + 5)) {
        *(uint64_t *)p = (uVar1 + 5) - (long)len_local;
        buf_local._0_4_ = 1;
      }
      else {
        *(uint64_t *)p = uVar1 + 5;
        buf_local._0_4_ = 0;
      }
    }
    else {
      buf_local._0_4_ = -1;
    }
  }
  return (int)buf_local;
}

Assistant:

static int
tnt_reply_len(const char *buf, size_t size, size_t *len)
{
	if (size < TNT_REPLY_IPROTO_HDR_SIZE) {
		*len = TNT_REPLY_IPROTO_HDR_SIZE - size;
		return 1;
	}
	const char *p = buf;
	if (mp_typeof(*p) != MP_UINT)
		return -1;
	size_t length = mp_decode_uint(&p);
	if (size < length + TNT_REPLY_IPROTO_HDR_SIZE) {
		*len = (length + TNT_REPLY_IPROTO_HDR_SIZE) - size;
		return 1;
	}
	*len = length + TNT_REPLY_IPROTO_HDR_SIZE;
	return 0;
}